

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
imrt::Station::getClosed
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Station *this,int beam)

{
  bool bVar1;
  undefined8 in_RAX;
  int aperture;
  undefined8 uStack_28;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  aperture = 0;
  uStack_28 = in_RAX;
  while (uStack_28 = CONCAT44(aperture,(undefined4)uStack_28), aperture < this->max_apertures) {
    bVar1 = isOpenBeamlet(this,beam,aperture);
    if (!bVar1) {
      std::vector<int,_std::allocator<int>_>::push_back
                (__return_storage_ptr__,(value_type_conflict2 *)((long)&uStack_28 + 4));
    }
    aperture = uStack_28._4_4_ + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> Station::getClosed(int beam) {
    vector<int> closed;
    for (int i =0;i<max_apertures;i++){
      if (!isOpenBeamlet(beam,i)) closed.push_back(i);
    }
    return(closed);
  }